

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

token_type __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::scan_number(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              *this)

{
  char cVar1;
  int_type iVar2;
  int *piVar3;
  ulonglong uVar4;
  char *pcVar5;
  token_type tVar6;
  long lVar7;
  int iVar8;
  double dVar9;
  char *endptr;
  char *local_28;
  
  reset(this);
  iVar8 = this->current;
  cVar1 = (char)this;
  if (iVar8 - 0x31U < 9) {
    iVar8 = 5;
LAB_0017245d:
    std::__cxx11::string::push_back(cVar1 + '8');
    while (iVar2 = get(this), iVar2 - 0x30U < 10) {
      std::__cxx11::string::push_back(cVar1 + '8');
    }
    if (iVar2 != 0x2e) {
      if ((iVar2 != 0x45) && (iVar2 != 0x65)) {
LAB_001724a5:
        unget(this);
        local_28 = (pointer)0x0;
        piVar3 = __errno_location();
        *piVar3 = 0;
        pcVar5 = (this->token_buffer)._M_dataplus._M_p;
        if (iVar8 == 5) {
          uVar4 = strtoull(pcVar5,&local_28,10);
          if (local_28 !=
              (this->token_buffer)._M_dataplus._M_p + (this->token_buffer)._M_string_length) {
            __assert_fail("endptr == token_buffer.data() + token_buffer.size()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/lib/json/include/nlohmann/json.hpp"
                          ,0xb10,
                          "token_type nlohmann::detail::lexer<nlohmann::basic_json<>>::scan_number() [BasicJsonType = nlohmann::basic_json<>]"
                         );
          }
          if (*piVar3 == 0) {
            tVar6 = value_unsigned;
            lVar7 = 0x68;
LAB_0017256e:
            *(ulonglong *)
             ((long)&(this->ia).
                     super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr + lVar7) = uVar4;
            return tVar6;
          }
        }
        else {
          uVar4 = strtoll(pcVar5,&local_28,10);
          if (local_28 !=
              (this->token_buffer)._M_dataplus._M_p + (this->token_buffer)._M_string_length) {
            __assert_fail("endptr == token_buffer.data() + token_buffer.size()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/lib/json/include/nlohmann/json.hpp"
                          ,0xb20,
                          "token_type nlohmann::detail::lexer<nlohmann::basic_json<>>::scan_number() [BasicJsonType = nlohmann::basic_json<>]"
                         );
          }
          if (*piVar3 == 0) {
            tVar6 = value_integer;
            lVar7 = 0x60;
            goto LAB_0017256e;
          }
        }
        goto LAB_0017251b;
      }
      goto LAB_00172655;
    }
LAB_0017257e:
    std::__cxx11::string::push_back(cVar1 + '8');
    iVar2 = get(this);
    if (9 < iVar2 - 0x30U) {
      pcVar5 = "invalid number; expected digit after \'.\'";
      goto LAB_00172682;
    }
    do {
      std::__cxx11::string::push_back(cVar1 + '8');
      iVar2 = get(this);
    } while (iVar2 - 0x30U < 10);
    if ((iVar2 == 0x65) || (iVar2 == 0x45)) goto LAB_00172655;
  }
  else {
    if (iVar8 == 0x30) {
      std::__cxx11::string::push_back(cVar1 + '8');
      iVar8 = 5;
    }
    else {
      if (iVar8 != 0x2d) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/lib/json/include/nlohmann/json.hpp"
                      ,0xa18,
                      "token_type nlohmann::detail::lexer<nlohmann::basic_json<>>::scan_number() [BasicJsonType = nlohmann::basic_json<>]"
                     );
      }
      std::__cxx11::string::push_back(cVar1 + '8');
      iVar2 = get(this);
      if (iVar2 - 0x31U < 9) {
        iVar8 = 6;
        goto LAB_0017245d;
      }
      if (iVar2 != 0x30) {
        pcVar5 = "invalid number; expected digit after \'-\'";
        goto LAB_00172682;
      }
      std::__cxx11::string::push_back(cVar1 + '8');
      iVar8 = 6;
    }
    iVar2 = get(this);
    if ((iVar2 != 0x65) && (iVar2 != 0x45)) {
      if (iVar2 != 0x2e) goto LAB_001724a5;
      goto LAB_0017257e;
    }
LAB_00172655:
    std::__cxx11::string::push_back(cVar1 + '8');
    iVar2 = get(this);
    if (9 < iVar2 - 0x30U) {
      if ((iVar2 != 0x2d) && (iVar2 != 0x2b)) {
        pcVar5 = "invalid number; expected \'+\', \'-\', or digit after exponent";
LAB_00172682:
        this->error_message = pcVar5;
        return parse_error;
      }
      std::__cxx11::string::push_back(cVar1 + '8');
      iVar2 = get(this);
      if (9 < iVar2 - 0x30U) {
        pcVar5 = "invalid number; expected digit after exponent sign";
        goto LAB_00172682;
      }
    }
    lexer<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
    ::scan_number();
  }
  unget(this);
  local_28 = (pointer)0x0;
  piVar3 = __errno_location();
  *piVar3 = 0;
LAB_0017251b:
  dVar9 = strtod((this->token_buffer)._M_dataplus._M_p,&local_28);
  this->value_float = dVar9;
  if (local_28 == (this->token_buffer)._M_dataplus._M_p + (this->token_buffer)._M_string_length) {
    return value_float;
  }
  __assert_fail("endptr == token_buffer.data() + token_buffer.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/lib/json/include/nlohmann/json.hpp"
                ,0xb31,
                "token_type nlohmann::detail::lexer<nlohmann::basic_json<>>::scan_number() [BasicJsonType = nlohmann::basic_json<>]"
               );
}

Assistant:

token_type scan_number()
{
// reset token_buffer to store the number's bytes
reset();

// the type of the parsed number; initially set to unsigned; will be
// changed if minus sign, decimal point or exponent is read
token_type number_type = token_type::value_unsigned;

// state (init): we just found out we need to scan a number
switch (current)
{
case '-':
{
add(current);
goto scan_number_minus;
}

case '0':
{
add(current);
goto scan_number_zero;
}

case '1':
case '2':
case '3':
case '4':
case '5':
case '6':
case '7':
case '8':
case '9':
{
add(current);
goto scan_number_any1;
}

default:
{
// all other characters are rejected outside scan_number()
assert(false); // LCOV_EXCL_LINE
}
}

scan_number_minus:
// state: we just parsed a leading minus sign
number_type = token_type::value_integer;
switch (get())
{
case '0':
{
add(current);
goto scan_number_zero;
}

case '1':
case '2':
case '3':
case '4':
case '5':
case '6':
case '7':
case '8':
case '9':
{
add(current);
goto scan_number_any1;
}

default:
{
error_message = "invalid number; expected digit after '-'";
return token_type::parse_error;
}
}

scan_number_zero:
// state: we just parse a zero (maybe with a leading minus sign)
switch (get())
{
case '.':
{
add(decimal_point_char);
goto scan_number_decimal1;
}

case 'e':
case 'E':
{
add(current);
goto scan_number_exponent;
}

default:
goto scan_number_done;
}

scan_number_any1:
// state: we just parsed a number 0-9 (maybe with a leading minus sign)
switch (get())
{
case '0':
case '1':
case '2':
case '3':
case '4':
case '5':
case '6':
case '7':
case '8':
case '9':
{
add(current);
goto scan_number_any1;
}

case '.':
{
add(decimal_point_char);
goto scan_number_decimal1;
}

case 'e':
case 'E':
{
add(current);
goto scan_number_exponent;
}

default:
goto scan_number_done;
}

scan_number_decimal1:
// state: we just parsed a decimal point
number_type = token_type::value_float;
switch (get())
{
case '0':
case '1':
case '2':
case '3':
case '4':
case '5':
case '6':
case '7':
case '8':
case '9':
{
add(current);
goto scan_number_decimal2;
}

default:
{
error_message = "invalid number; expected digit after '.'";
return token_type::parse_error;
}
}

scan_number_decimal2:
// we just parsed at least one number after a decimal point
switch (get())
{
case '0':
case '1':
case '2':
case '3':
case '4':
case '5':
case '6':
case '7':
case '8':
case '9':
{
add(current);
goto scan_number_decimal2;
}

case 'e':
case 'E':
{
add(current);
goto scan_number_exponent;
}

default:
goto scan_number_done;
}

scan_number_exponent:
// we just parsed an exponent
number_type = token_type::value_float;
switch (get())
{
case '+':
case '-':
{
add(current);
goto scan_number_sign;
}

case '0':
case '1':
case '2':
case '3':
case '4':
case '5':
case '6':
case '7':
case '8':
case '9':
{
add(current);
goto scan_number_any2;
}

default:
{
error_message =
"invalid number; expected '+', '-', or digit after exponent";
return token_type::parse_error;
}
}

scan_number_sign:
// we just parsed an exponent sign
switch (get())
{
case '0':
case '1':
case '2':
case '3':
case '4':
case '5':
case '6':
case '7':
case '8':
case '9':
{
add(current);
goto scan_number_any2;
}

default:
{
error_message = "invalid number; expected digit after exponent sign";
return token_type::parse_error;
}
}

scan_number_any2:
// we just parsed a number after the exponent or exponent sign
switch (get())
{
case '0':
case '1':
case '2':
case '3':
case '4':
case '5':
case '6':
case '7':
case '8':
case '9':
{
add(current);
goto scan_number_any2;
}

default:
goto scan_number_done;
}

scan_number_done:
// unget the character after the number (we only read it to know that
// we are done scanning a number)
unget();

char* endptr = nullptr;
errno = 0;

// try to parse integers first and fall back to floats
if (number_type == token_type::value_unsigned)
{
const auto x = std::strtoull(token_buffer.data(), &endptr, 10);

// we checked the number format before
assert(endptr == token_buffer.data() + token_buffer.size());

if (errno == 0)
{
value_unsigned = static_cast<number_unsigned_t>(x);
if (value_unsigned == x)
{
return token_type::value_unsigned;
}
}
}
else if (number_type == token_type::value_integer)
{
const auto x = std::strtoll(token_buffer.data(), &endptr, 10);

// we checked the number format before
assert(endptr == token_buffer.data() + token_buffer.size());

if (errno == 0)
{
value_integer = static_cast<number_integer_t>(x);
if (value_integer == x)
{
return token_type::value_integer;
}
}
}

// this code is reached if we parse a floating-point number or if an
// integer conversion above failed
strtof(value_float, token_buffer.data(), &endptr);

// we checked the number format before
assert(endptr == token_buffer.data() + token_buffer.size());

return token_type::value_float;
}